

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

void __thiscall
bandit::context::bandit::run_all
          (bandit *this,
          list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *funcs)

{
  _List_node_base *p_Var1;
  function<void_()> f;
  _Any_data _Stack_38;
  code *local_28;
  code *local_20;
  
  p_Var1 = (funcs->
           super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var1 == (_List_node_base *)funcs) {
      return;
    }
    std::function<void_()>::function
              ((function<void_()> *)&_Stack_38,(function<void_()> *)(p_Var1 + 1));
    if (local_28 == (code *)0x0) break;
    (*local_20)(&_Stack_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
    }
    p_Var1 = (((_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
              &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  std::__throw_bad_function_call();
}

Assistant:

void run_all(const std::list<std::function<void()>>& funcs) {
        for (auto f : funcs) {
          f();
        }
      }